

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gchtfind.c
# Opt level: O1

LispPTR rec_htfind(LispPTR ptr,int casep)

{
  uint *puVar1;
  bool bVar2;
  ulong uVar3;
  uint *extraout_RAX;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  LispPTR LVar7;
  LispPTR *pLVar8;
  uint uVar9;
  
  uVar6 = ptr >> 0xf & 0x1ffe;
  puVar1 = (uint *)((long)HTmain + (ulong)(ptr & 0xfffe) * 2);
  uVar9 = *puVar1;
  if (uVar9 == 0) {
    if (casep == 2) {
      uVar6 = uVar6 | 0x30000;
LAB_0012460d:
      *puVar1 = uVar6;
      return 0;
    }
    if (casep == 1) {
      *puVar1 = uVar6;
      return ptr;
    }
    if (casep == 0) {
      uVar6 = uVar6 | 0x40000;
      goto LAB_0012460d;
    }
    goto LAB_0012487e;
  }
  if ((uVar9 & 1) != 0) {
    puVar4 = HTcoll + (uVar9 - 1);
    uVar9 = *puVar4;
    if (uVar6 == (uVar9 & 0x1ffe)) {
      puVar5 = (uint *)0x0;
    }
    else {
      do {
        puVar5 = puVar4;
        if ((ulong)puVar5[1] == 0) {
          uVar3 = (ulong)*HTcoll;
          if (uVar3 == 0) {
            uVar3 = (ulong)HTcoll[1];
            if (uVar3 < 0x7fff0) {
              HTcoll[1] = HTcoll[1] + 2;
              goto LAB_001247da;
            }
            bVar2 = false;
            disablegc1(0);
          }
          else {
            *HTcoll = HTcoll[uVar3 + 1];
LAB_001247da:
            puVar5 = HTcoll + uVar3;
            bVar2 = true;
          }
          if (!bVar2) {
            return 0;
          }
          puVar5[1] = *puVar1 - 1;
          *puVar1 = (int)((ulong)((long)puVar5 - (long)HTcoll) >> 2) + 1;
          if (casep == 2) {
            uVar6 = uVar6 | 0x30000;
          }
          else {
            if (casep == 1) {
              *puVar5 = uVar6;
              return ptr;
            }
            if (casep != 0) goto LAB_0012487e;
            uVar6 = uVar6 | 0x40000;
          }
          *puVar5 = uVar6;
          return 0;
        }
        puVar4 = HTcoll + puVar5[1];
        uVar9 = *puVar4;
      } while (uVar6 != (uVar9 & 0x1ffe));
    }
    if (uVar9 < 0xfffe0000) {
      if (casep == 2) {
        uVar9 = uVar9 | 0x10000;
      }
      else {
        if (casep == 1) {
          if (uVar9 < 0x20000) {
            error("attempt to decrement 0 reference count");
          }
          uVar9 = uVar9 - 0x20000;
        }
        else if ((casep == 0) && (uVar9 = uVar9 + 0x20000, 0xfffdffff < uVar9)) {
          *puVar4 = uVar9;
LAB_0012465c:
          enter_big_reference_count(ptr);
          return 0;
        }
        if ((uVar9 & 0xffff0000) == 0x20000) {
          if (puVar5 == (uint *)0x0) {
            *puVar1 = puVar4[1] | 1;
          }
          else {
            puVar5[1] = puVar4[1];
          }
          *puVar4 = 0;
          puVar4[1] = *HTcoll;
          *HTcoll = (LispPTR)((ulong)((long)puVar4 - (long)HTcoll) >> 2);
          if (HTcoll[(ulong)(*puVar1 - 1) + 1] != 0) {
            return 0;
          }
          puVar4 = HTcoll + (*puVar1 - 1);
          *puVar1 = *puVar4;
          *puVar4 = 0;
          puVar4[1] = *HTcoll;
          *HTcoll = (LispPTR)((ulong)((long)puVar4 - (long)HTcoll) >> 2);
          return 0;
        }
      }
      *puVar4 = uVar9;
      return 0;
    }
LAB_001245be:
    modify_big_reference_count(puVar4,(DLword)casep,ptr);
    return 0;
  }
  if (uVar6 == (uVar9 & 0x1ffe)) {
    puVar4 = puVar1;
    if (uVar9 < 0xfffe0000) {
      if (casep == 2) {
        uVar9 = uVar9 | 0x10000;
      }
      else {
        if (casep == 1) {
          if (uVar9 < 0x20000) {
            error("attempt to decrement 0 reference count");
          }
          uVar9 = uVar9 - 0x20000;
        }
        else if ((casep == 0) && (uVar9 = uVar9 + 0x20000, 0xfffdffff < uVar9)) {
          *puVar1 = uVar9;
          goto LAB_0012465c;
        }
        if ((uVar9 & 0xffff0000) == 0x20000) {
          *puVar1 = 0;
          return 0;
        }
      }
      *puVar1 = uVar9;
      return 0;
    }
    goto LAB_001245be;
  }
  uVar3 = (ulong)*HTcoll;
  if (uVar3 == 0) {
    uVar3 = (ulong)HTcoll[1];
    if (uVar3 < 0x7fff0) {
      HTcoll[1] = HTcoll[1] + 2;
      goto LAB_001246cf;
    }
    bVar2 = false;
    pLVar8 = (LispPTR *)(ulong)(uint)casep;
    disablegc1(0);
  }
  else {
    *HTcoll = HTcoll[uVar3 + 1];
LAB_001246cf:
    pLVar8 = HTcoll + uVar3;
    bVar2 = true;
  }
  if (!bVar2) {
    return 0;
  }
  uVar3 = (ulong)*HTcoll;
  if (uVar3 == 0) {
    uVar3 = (ulong)HTcoll[1];
    if (uVar3 < 0x7fff0) {
      HTcoll[1] = HTcoll[1] + 2;
      goto LAB_0012482e;
    }
    bVar2 = false;
    disablegc1(0);
    puVar4 = extraout_RAX;
  }
  else {
    *HTcoll = HTcoll[uVar3 + 1];
LAB_0012482e:
    puVar4 = HTcoll + uVar3;
    bVar2 = true;
  }
  if (!bVar2) {
    return 0;
  }
  puVar4[1] = 0;
  *puVar4 = uVar9;
  pLVar8[1] = (LispPTR)((ulong)((long)puVar4 - (long)HTcoll) >> 2);
  *puVar1 = (int)((ulong)((long)pLVar8 - (long)HTcoll) >> 2) + 1;
  if (casep == 2) {
    LVar7 = uVar6 | 0x30000;
  }
  else {
    if (casep == 1) {
      *pLVar8 = uVar6;
      return ptr;
    }
    if (casep != 0) {
LAB_0012487e:
      error("GC error: new entry when turning off stack bit");
      return 0;
    }
    LVar7 = uVar6 | 0x40000;
  }
  *pLVar8 = LVar7;
  return 0;
}

Assistant:

LispPTR rec_htfind(LispPTR ptr, int casep) {
  GCENTRY *entry, *link, *prev;
  GCENTRY entry_contents, hiptr;

  /* if the NOREF bit is on in the type table entry, do
  not reference count this pointer. Used for non-reference
  counted types like symbols, and also when the GC is
  disabled. */
  /*
   * Following two tests were moved into GCLOOKUP macro
   * for efficiency.
   */
  /*
      if (GetTypeEntry(ptr) & TT_NOREF)
                  return NIL;
  */
  /* if *GcDisabled_word is T then do nothing */
  /* FS:  this test should not be needed (because type table should
      be cleared).  Also, this test seems to cause an infinite
      ucode loop in remimplicitkeyhash on the 386i		*/

  /*    if(*GcDisabled_word == ATOM_T) return(NIL); */

  /* GC hash table entries have the high 8 bits of the
  pointer stored in the middle. Set up hiptr to have
  the high bits of the pointer ready to store or test
  against */

  hiptr = (((unsigned int)ptr) >> (16 - HTHISHIFT)) & HTHIMASK;

  /* entry points at the place in the main hash table
  where this pointer is stored. The 'hash' isn't one really;
  it just uses the low bits of the pointer. */

  entry = HTmain + (LOLOC(ptr) >> 1);

  entry_contents = GETGC(entry);

  if (entry_contents == 0) RecNewEntry(entry, hiptr, casep, ptr);
  /* NewEntry returns */

  if (entry_contents & 1) { /* low bit means a collision entry */
    /* entry_contents-1 removes low bit */
    link = HTcoll + (entry_contents - 1);
    prev = 0;
    goto newlink;
  }

  if (hiptr == (entry_contents & HTHIMASK)) {
    RecModEntry(entry, entry_contents, ptr, casep, delentry);
    /* ModEntry returns or will go to delentry */
  }

  /* new collision */

  GetLink(link);
  GetLink(prev);
  GETGC((GCENTRY *)prev + 1) = 0;
  GETGC((GCENTRY *)prev) = entry_contents;
  GETGC((GCENTRY *)link + 1) = prev - HTcoll;
  GETGC((GCENTRY *)entry) = (link - HTcoll) + 1;

  RecNewEntry(link, hiptr, casep, ptr);

delentry:
  GETGC(entry) = 0;
  return NIL;

/* start here when a collision is detected. link is a pointer to
  the entry in the collision table, prev is the previous collision
  entry or 0 if this is the first one. */

newlink:
  entry_contents = GETGC(link);
  if (hiptr == (entry_contents & HTHIMASK)) {
    RecModEntry(link, entry_contents, ptr, casep, dellink);
    /* ModEntry returns or goes to dellink */
  }
  /* collision didn't match  */
  entry_contents = GETGC(link + 1);
  if (entry_contents == 0) { goto nolink; }
  /* try the next link in the collision table */
  prev = link;
  link = HTcoll + entry_contents;
  goto newlink;

dellink:
  if (prev)
    GETGC((GCENTRY *)prev + 1) = GETGC((GCENTRY *)link + 1);
  else
    GETGC((GCENTRY *)entry) = (GETGC((GCENTRY *)link + 1)) | 1;

  FreeLink(link);
  link = HTcoll + ((GETGC((GCENTRY *)entry)) - 1);
  if (GETGC((GCENTRY *)link + 1) == 0) {
    GETGC((GCENTRY *)entry) = GETGC((GCENTRY *)link);
    FreeLink(link);
  }
  return NIL;

nolink: /* no match */

  GetLink(link);
  GETGC((GCENTRY *)link + 1) = GETGC((GCENTRY *)entry) - 1;
  GETGC((GCENTRY *)entry) = (link - HTcoll) + 1;
  RecNewEntry(link, hiptr, casep, ptr);
}